

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void ec_pubkey_parse_pointtest(uchar *input,int xvalid,int yvalid)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  secp256k1_context *extraout_RAX;
  secp256k1_context *psVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  secp256k1_pubkey *pubkey_00;
  uint uVar11;
  bool bVar12;
  int32_t ecount;
  unsigned_long _zzq_result_3;
  size_t outl;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  secp256k1_pubkey pubkey;
  uchar pubkeyc [65];
  secp256k1_ge ge;
  int local_1fc [3];
  size_t local_1f0;
  secp256k1_ge_storage local_1e8;
  int local_19c;
  byte local_198 [8];
  secp256k1_pubkey *local_190;
  long local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  size_t local_148;
  int local_140;
  uint local_13c;
  undefined1 local_138 [8];
  secp256k1_pubkey *psStack_130;
  uint64_t local_128;
  uint64_t uStack_120;
  uint64_t local_118;
  uint64_t uStack_110;
  uint64_t local_108;
  uint64_t uStack_100;
  secp256k1_pubkey *local_f8;
  ulong local_f0;
  byte local_e8;
  undefined8 local_e7;
  undefined8 uStack_df;
  undefined8 local_d7;
  undefined8 uStack_cf;
  undefined8 local_c7;
  undefined8 uStack_bf;
  undefined8 local_b7;
  undefined8 uStack_af;
  secp256k1_ge local_98;
  
  psVar5 = CTX;
  local_1fc[0] = 0;
  local_19c = xvalid;
  local_140 = yvalid;
  if (secp256k1_context_static == CTX) goto LAB_0015d3f9;
  (CTX->illegal_callback).fn = counting_illegal_callback_fn;
  (psVar5->illegal_callback).data = local_1fc;
  do {
    sVar6 = 3;
    local_f8 = (secp256k1_pubkey *)input;
LAB_0015cc37:
    bVar12 = local_19c != 0;
    local_b7 = *(undefined8 *)(((secp256k1_pubkey *)input)->data + 0x30);
    uStack_af = *(undefined8 *)(((secp256k1_pubkey *)input)->data + 0x38);
    local_c7 = *(undefined8 *)(((secp256k1_pubkey *)input)->data + 0x20);
    uStack_bf = *(undefined8 *)(((secp256k1_pubkey *)input)->data + 0x28);
    local_d7 = *(undefined8 *)(((secp256k1_pubkey *)input)->data + 0x10);
    uStack_cf = *(undefined8 *)(((secp256k1_pubkey *)input)->data + 0x18);
    local_e7 = *(undefined8 *)((secp256k1_pubkey *)input)->data;
    uStack_df = *(undefined8 *)(((secp256k1_pubkey *)input)->data + 8);
    local_190 = (secp256k1_pubkey *)(&local_e8 + sVar6);
    lVar4 = sVar6 - 0x41;
    local_188 = -lVar4;
    local_180 = 0;
    local_178 = 0;
    local_170 = 0;
    local_13c = (uint)(lVar4 == 0) * 4;
    local_f0 = (ulong)(lVar4 == 0 || sVar6 == 0x21);
    uVar7 = 0;
    local_148 = sVar6;
    while( true ) {
      local_e8 = (byte)uVar7;
      uVar11 = ((secp256k1_pubkey *)input)->data[0x3f] & 1 | 2;
      if ((local_19c == 0 || local_140 == 0) || (uVar7 & 4) != local_13c) {
        bVar10 = 0;
      }
      else {
        bVar10 = ((uVar7 & 0xfb) == uVar11 || uVar7 == 4) & (byte)local_f0;
      }
      if ((((bVar12 && sVar6 == 0x21) && (uVar7 & 0xfe) == 2) | bVar10) == 1) break;
      local_108 = 0xfefefefefefefefe;
      uStack_100 = 0xfefefefefefefefe;
      local_118 = 0xfefefefefefefefe;
      uStack_110 = 0xfefefefefefefefe;
      local_128 = 0xfefefefefefefefe;
      uStack_120 = 0xfefefefefefefefe;
      local_138 = (undefined1  [8])0xfefefefefefefefe;
      psStack_130 = (secp256k1_pubkey *)0xfefefefefefefefe;
      local_1fc[0] = 0;
      local_198[0] = 1;
      local_198[1] = 0;
      local_198[2] = 0x43;
      local_198[3] = 0x4d;
      local_198[4] = 0;
      local_198[5] = 0;
      local_198[6] = 0;
      local_198[7] = 0;
      local_188 = 0x40;
      local_180 = 0;
      local_178 = 0;
      local_170 = 0;
      local_1e8.x.n[0] = 0;
      local_190 = (secp256k1_pubkey *)local_138;
      iVar3 = secp256k1_ec_pubkey_parse(CTX,(secp256k1_pubkey *)local_138,&local_e8,local_148);
      if (iVar3 != 0) {
        ec_pubkey_parse_pointtest_cold_1();
LAB_0015d3ae:
        ec_pubkey_parse_pointtest_cold_16();
        pubkey_00 = (secp256k1_pubkey *)input;
LAB_0015d3b3:
        ec_pubkey_parse_pointtest_cold_15();
LAB_0015d3b8:
        ec_pubkey_parse_pointtest_cold_2();
LAB_0015d3bd:
        ec_pubkey_parse_pointtest_cold_5();
        input = pubkey_00->data;
LAB_0015d3c2:
        ec_pubkey_parse_pointtest_cold_3();
LAB_0015d3c7:
        ec_pubkey_parse_pointtest_cold_6();
LAB_0015d3cc:
        ec_pubkey_parse_pointtest_cold_4();
LAB_0015d3d1:
        ec_pubkey_parse_pointtest_cold_14();
LAB_0015d3d6:
        ec_pubkey_parse_pointtest_cold_11();
LAB_0015d3db:
        ec_pubkey_parse_pointtest_cold_7();
LAB_0015d3e0:
        ec_pubkey_parse_pointtest_cold_13();
LAB_0015d3e5:
        ec_pubkey_parse_pointtest_cold_12();
LAB_0015d3ea:
        ec_pubkey_parse_pointtest_cold_8();
LAB_0015d3ef:
        ec_pubkey_parse_pointtest_cold_9();
        goto LAB_0015d3f4;
      }
      local_198[0] = 5;
      local_198[1] = 0;
      local_198[2] = 0x43;
      local_198[3] = 0x4d;
      local_198[4] = 0;
      local_198[5] = 0;
      local_198[6] = 0;
      local_198[7] = 0;
      local_188 = 0x40;
      local_180 = 0;
      local_178 = 0;
      local_170 = 0;
      local_1e8.x.n[0] = 0;
      pubkey_00 = (secp256k1_pubkey *)input;
      local_190 = (secp256k1_pubkey *)local_138;
      if (local_1fc[0] != 0) goto LAB_0015d3b8;
      iVar3 = secp256k1_pubkey_load(CTX,&local_98,(secp256k1_pubkey *)local_138);
      if (iVar3 != 0) goto LAB_0015d3c2;
      if (local_1fc[0] != 1) goto LAB_0015d3cc;
LAB_0015d34f:
      psVar5 = CTX;
      uVar7 = uVar7 + 1;
      if (uVar7 == 0x100) goto code_r0x0015d35d;
    }
    local_138 = (undefined1  [8])0x0;
    psStack_130 = (secp256k1_pubkey *)0x0;
    local_128 = 0;
    uStack_120 = 0;
    local_118 = 0;
    uStack_110 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_198[0] = 1;
    local_198[1] = 0;
    local_198[2] = 0x43;
    local_198[3] = 0x4d;
    local_198[4] = 0;
    local_198[5] = 0;
    local_198[6] = 0;
    local_198[7] = 0;
    pubkey_00 = (secp256k1_pubkey *)local_138;
    local_188 = 0x40;
    local_180 = 0;
    local_178 = 0;
    local_170 = 0;
    local_1e8.x.n[0] = 0;
    local_1fc[0] = 0;
    local_190 = pubkey_00;
    iVar3 = secp256k1_ec_pubkey_parse(CTX,pubkey_00,&local_e8,local_148);
    input = (uchar *)pubkey_00;
    if (iVar3 == 0) goto LAB_0015d3ae;
    local_198[0] = 5;
    local_198[1] = 0;
    local_198[2] = 0x43;
    local_198[3] = 0x4d;
    local_198[4] = 0;
    local_198[5] = 0;
    local_198[6] = 0;
    local_198[7] = 0;
    local_188 = 0x40;
    local_180 = 0;
    local_178 = 0;
    local_170 = 0;
    local_1f0 = 0x41;
    local_1e8.x.n[0] = 0x4d430001;
    local_1e8.x.n[2] = 0x41;
    local_1e8.x.n[3] = 0;
    local_1e8.y.n[0] = 0;
    local_1e8.y.n[1] = 0;
    local_1fc[1] = 0;
    local_1fc[2] = 0;
    uVar8 = 0x102;
    local_1e8.x.n[1] = (uint64_t)local_198;
    local_190 = pubkey_00;
    iVar3 = secp256k1_ec_pubkey_serialize(CTX,local_198,&local_1f0,pubkey_00,0x102);
    input = local_f8->data;
    if (iVar3 == 0) goto LAB_0015d3b3;
    local_1e8.x.n[0] = 0x4d430005;
    local_1e8.x.n[2] = local_1f0;
    local_1e8.x.n[3] = 0;
    local_1e8.y.n[0] = 0;
    local_1e8.y.n[1] = 0;
    local_1fc[1] = 0;
    local_1fc[2] = 0;
    local_1e8.x.n[1] = (uint64_t)local_198;
    if (local_1f0 != 0x21) goto LAB_0015d3bd;
    lVar4 = 1;
    do {
      bVar1 = local_198[lVar4];
      bVar2 = (&local_e8)[lVar4];
      uVar9 = (ulong)((uint)bVar1 - (uint)bVar2);
      if (bVar1 == bVar2) {
        uVar9 = uVar8 & 0xffffffff;
      }
      iVar3 = (int)uVar9;
      if (bVar1 != bVar2) goto LAB_0015cf99;
      lVar4 = lVar4 + 1;
      uVar8 = uVar9;
    } while (lVar4 != 0x21);
    iVar3 = 0;
LAB_0015cf99:
    if (iVar3 != 0) goto LAB_0015d3c7;
    if ((local_148 == 0x21) && (local_198[0] != local_e8)) goto LAB_0015d3d1;
    if (bVar10 == 0) {
LAB_0015d203:
      local_1e8.x.n[1] = (uint64_t)local_198;
      local_1e8.y.n[1] = 0;
      local_1e8.y.n[0] = 0;
      local_1e8.x.n[3] = 0;
      local_1e8.x.n[0] = 0x4d430005;
      local_1fc[1] = 0;
      local_1fc[2] = 0;
      local_1e8.x.n[2] = local_1f0;
      if (local_1fc[0] == 0) goto LAB_0015d34f;
      goto LAB_0015d3d6;
    }
    if (local_198[0] != (byte)uVar11) goto LAB_0015d3db;
    iVar3 = secp256k1_pubkey_load(CTX,&local_98,(secp256k1_pubkey *)local_138);
    if (iVar3 == 0) goto LAB_0015d3e0;
    local_108._0_1_ = '\0';
    local_108._1_1_ = '\0';
    local_108._2_1_ = '\0';
    local_108._3_1_ = '\0';
    local_108._4_1_ = '\0';
    local_108._5_1_ = '\0';
    local_108._6_1_ = '\0';
    local_108._7_1_ = '\0';
    uStack_100._0_1_ = '\0';
    uStack_100._1_1_ = '\0';
    uStack_100._2_1_ = '\0';
    uStack_100._3_1_ = '\0';
    uStack_100._4_1_ = '\0';
    uStack_100._5_1_ = '\0';
    uStack_100._6_1_ = '\0';
    uStack_100._7_1_ = '\0';
    local_118._0_1_ = '\0';
    local_118._1_1_ = '\0';
    local_118._2_1_ = '\0';
    local_118._3_1_ = '\0';
    local_118._4_1_ = '\0';
    local_118._5_1_ = '\0';
    local_118._6_1_ = '\0';
    local_118._7_1_ = '\0';
    uStack_110._0_1_ = '\0';
    uStack_110._1_1_ = '\0';
    uStack_110._2_1_ = '\0';
    uStack_110._3_1_ = '\0';
    uStack_110._4_1_ = '\0';
    uStack_110._5_1_ = '\0';
    uStack_110._6_1_ = '\0';
    uStack_110._7_1_ = '\0';
    local_128._0_1_ = '\0';
    local_128._1_1_ = '\0';
    local_128._2_1_ = '\0';
    local_128._3_1_ = '\0';
    local_128._4_1_ = '\0';
    local_128._5_1_ = '\0';
    local_128._6_1_ = '\0';
    local_128._7_1_ = '\0';
    uStack_120._0_1_ = '\0';
    uStack_120._1_1_ = '\0';
    uStack_120._2_1_ = '\0';
    uStack_120._3_1_ = '\0';
    uStack_120._4_1_ = '\0';
    uStack_120._5_1_ = '\0';
    uStack_120._6_1_ = '\0';
    uStack_120._7_1_ = '\0';
    local_138[0] = '\0';
    local_138[1] = '\0';
    local_138[2] = '\0';
    local_138[3] = '\0';
    local_138[4] = '\0';
    local_138[5] = '\0';
    local_138[6] = '\0';
    local_138[7] = '\0';
    psStack_130 = (secp256k1_pubkey *)0x0;
    local_1e8.x.n[0] = 0x4d430001;
    local_1e8.x.n[2] = 0x40;
    local_1e8.x.n[3] = 0;
    local_1e8.y.n[0] = 0;
    local_1e8.y.n[1] = 0;
    local_1fc[1] = 0;
    local_1fc[2] = 0;
    local_1e8.x.n[1] = (uint64_t)local_138;
    secp256k1_ge_to_storage(&local_1e8,&local_98);
    local_108 = local_1e8.y.n[2];
    uStack_100 = local_1e8.y.n[3];
    local_118 = local_1e8.y.n[0];
    uStack_110 = local_1e8.y.n[1];
    local_128 = local_1e8.x.n[2];
    uStack_120 = local_1e8.x.n[3];
    local_138 = (undefined1  [8])local_1e8.x.n[0];
    psStack_130 = (secp256k1_pubkey *)local_1e8.x.n[1];
    local_1f0 = 0x41;
    local_1e8.x.n[0] = 0x4d430001;
    local_1e8.x.n[2] = 0x41;
    local_1e8.x.n[3] = 0;
    local_1e8.y.n[0] = 0;
    local_1e8.y.n[1] = 0;
    local_1fc[1] = 0;
    local_1fc[2] = 0;
    local_1e8.x.n[1] = (uint64_t)local_198;
    iVar3 = secp256k1_ec_pubkey_serialize(CTX,local_198,&local_1f0,(secp256k1_pubkey *)local_138,2);
    if (iVar3 == 0) goto LAB_0015d3e5;
    local_1e8.x.n[0] = 0x4d430005;
    local_1e8.x.n[2] = local_1f0;
    local_1e8.x.n[3] = 0;
    local_1e8.y.n[0] = 0;
    local_1e8.y.n[1] = 0;
    local_1fc[1] = 0;
    local_1fc[2] = 0;
    local_1e8.x.n[1] = (uint64_t)local_198;
    if (local_1f0 != 0x41) goto LAB_0015d3ea;
    if (local_198[0] != 4) goto LAB_0015d3ef;
    lVar4 = 0;
    do {
      iVar3 = (uint)local_198[lVar4 + 1] - (uint)((secp256k1_pubkey *)input)->data[lVar4];
      if (local_198[lVar4 + 1] != ((secp256k1_pubkey *)input)->data[lVar4]) goto LAB_0015d1fb;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x40);
    iVar3 = 0;
LAB_0015d1fb:
    if (iVar3 == 0) goto LAB_0015d203;
LAB_0015d3f4:
    ec_pubkey_parse_pointtest_cold_10();
    psVar5 = extraout_RAX;
LAB_0015d3f9:
    (*(psVar5->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar5->illegal_callback).data);
  } while( true );
code_r0x0015d35d:
  sVar6 = local_148 + 1;
  if (sVar6 == 0x42) {
    if (secp256k1_context_static == CTX) {
      (*(CTX->illegal_callback).fn)("ctx != secp256k1_context_static",(CTX->illegal_callback).data);
    }
    else {
      (CTX->illegal_callback).fn = secp256k1_default_illegal_callback_fn;
      (psVar5->illegal_callback).data = (void *)0x0;
    }
    return;
  }
  goto LAB_0015cc37;
}

Assistant:

static void ec_pubkey_parse_pointtest(const unsigned char *input, int xvalid, int yvalid) {
    unsigned char pubkeyc[65];
    secp256k1_pubkey pubkey;
    secp256k1_ge ge;
    size_t pubkeyclen;
    int32_t ecount;
    ecount = 0;
    secp256k1_context_set_illegal_callback(CTX, counting_illegal_callback_fn, &ecount);
    for (pubkeyclen = 3; pubkeyclen <= 65; pubkeyclen++) {
        /* Smaller sizes are tested exhaustively elsewhere. */
        int32_t i;
        memcpy(&pubkeyc[1], input, 64);
        SECP256K1_CHECKMEM_UNDEFINE(&pubkeyc[pubkeyclen], 65 - pubkeyclen);
        for (i = 0; i < 256; i++) {
            /* Try all type bytes. */
            int xpass;
            int ypass;
            int ysign;
            pubkeyc[0] = i;
            /* What sign does this point have? */
            ysign = (input[63] & 1) + 2;
            /* For the current type (i) do we expect parsing to work? Handled all of compressed/uncompressed/hybrid. */
            xpass = xvalid && (pubkeyclen == 33) && ((i & 254) == 2);
            /* Do we expect a parse and re-serialize as uncompressed to give a matching y? */
            ypass = xvalid && yvalid && ((i & 4) == ((pubkeyclen == 65) << 2)) &&
                ((i == 4) || ((i & 251) == ysign)) && ((pubkeyclen == 33) || (pubkeyclen == 65));
            if (xpass || ypass) {
                /* These cases must parse. */
                unsigned char pubkeyo[65];
                size_t outl;
                memset(&pubkey, 0, sizeof(pubkey));
                SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                ecount = 0;
                CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 1);
                SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                outl = 65;
                SECP256K1_CHECKMEM_UNDEFINE(pubkeyo, 65);
                CHECK(secp256k1_ec_pubkey_serialize(CTX, pubkeyo, &outl, &pubkey, SECP256K1_EC_COMPRESSED) == 1);
                SECP256K1_CHECKMEM_CHECK(pubkeyo, outl);
                CHECK(outl == 33);
                CHECK(secp256k1_memcmp_var(&pubkeyo[1], &pubkeyc[1], 32) == 0);
                CHECK((pubkeyclen != 33) || (pubkeyo[0] == pubkeyc[0]));
                if (ypass) {
                    /* This test isn't always done because we decode with alternative signs, so the y won't match. */
                    CHECK(pubkeyo[0] == ysign);
                    CHECK(secp256k1_pubkey_load(CTX, &ge, &pubkey) == 1);
                    memset(&pubkey, 0, sizeof(pubkey));
                    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                    secp256k1_pubkey_save(&pubkey, &ge);
                    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                    outl = 65;
                    SECP256K1_CHECKMEM_UNDEFINE(pubkeyo, 65);
                    CHECK(secp256k1_ec_pubkey_serialize(CTX, pubkeyo, &outl, &pubkey, SECP256K1_EC_UNCOMPRESSED) == 1);
                    SECP256K1_CHECKMEM_CHECK(pubkeyo, outl);
                    CHECK(outl == 65);
                    CHECK(pubkeyo[0] == 4);
                    CHECK(secp256k1_memcmp_var(&pubkeyo[1], input, 64) == 0);
                }
                CHECK(ecount == 0);
            } else {
                /* These cases must fail to parse. */
                memset(&pubkey, 0xfe, sizeof(pubkey));
                ecount = 0;
                SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 0);
                SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                CHECK(ecount == 0);
                CHECK(secp256k1_pubkey_load(CTX, &ge, &pubkey) == 0);
                CHECK(ecount == 1);
            }
        }
    }
    secp256k1_context_set_illegal_callback(CTX, NULL, NULL);
}